

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

bool __thiscall
CLOptions::SetParam(CLOptions *this,string *opt_name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *opt_vals)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  CLString *this_00;
  string *in_stack_00000118;
  CLBool *in_stack_00000120;
  string *in_stack_ffffffffffffff78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  key_type *in_stack_ffffffffffffff88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  *in_stack_ffffffffffffff90;
  key_type *in_stack_ffffffffffffffb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  *in_stack_ffffffffffffffc0;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                   *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (sVar1 == 0) {
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                     *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (sVar2 == 0) {
      sVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                       *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (sVar3 == 0) {
        sVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                ::count(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        if (sVar4 == 0) {
          return false;
        }
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front(in_stack_ffffffffffffff80);
        std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)pvVar5);
        this_00 = (CLString *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                                *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        CLString::operator=(this_00,in_stack_ffffffffffffff78);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::front(in_stack_ffffffffffffff80);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                      *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        CLInt::operator=((CLInt *)in_stack_00000120,in_stack_00000118);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front(in_stack_ffffffffffffff80);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                    *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      CLDouble::operator=((CLDouble *)in_stack_00000120,in_stack_00000118);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front(in_stack_ffffffffffffff80);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
    ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    CLBool::operator=(in_stack_00000120,in_stack_00000118);
  }
  return true;
}

Assistant:

bool CLOptions::SetParam(const std::string& opt_name,
                         std::vector<std::string> opt_vals)
{
    // Special check for the version parameter
    
    
    // Fill in the correct variable
    if (params_bools.count(opt_name) > 0) {
        *params_bools[opt_name] = opt_vals.front() ;
    } else if (params_doubles.count(opt_name) > 0) {
        *params_doubles[opt_name] = opt_vals.front() ;
    } else if (params_ints.count(opt_name) > 0) {
        *params_ints[opt_name] = opt_vals.front() ;
    } else if (params_strings.count(opt_name) > 0) {
        *params_strings[opt_name] = opt_vals.front() ;
    } else {
        return false ;
    }
    
    return true ;
}